

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  long lVar1;
  format fmt;
  string_type local_50;
  impl_string_type fn;
  
  filename((path *)&local_50,this);
  std::__cxx11::string::string((string *)&fn,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  lVar1 = std::__cxx11::string::rfind((char)&fn,0x2e);
  if (lVar1 + 1U < 2) {
    path<char[1],ghc::filesystem::path>(__return_storage_ptr__,(char (*) [1])0x17e102,auto_format);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&fn);
    path(__return_storage_ptr__,&local_50,fmt);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&fn);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::extension() const
{
    impl_string_type fn = filename().string();
    impl_string_type::size_type pos = fn.find_last_of('.');
    if (pos == std::string::npos || pos == 0) {
        return "";
    }
    return fn.substr(pos);
}